

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DancingNode.cpp
# Opt level: O1

DancingNode *
createToridolMatrix(vector<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>,_std::allocator<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>_>_>
                    *Matrix,int nRow,int nCol,
                   vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                   *ProbMat,DancingNode *header)

{
  ulong uVar1;
  long *plVar2;
  int *piVar3;
  pointer pvVar4;
  long lVar5;
  pointer pvVar6;
  long lVar7;
  s_DancingNode *psVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  
  if (-1 < nRow) {
    pvVar4 = (ProbMat->
             super__Vector_base<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar17 = 0;
    do {
      if (0 < nCol) {
        lVar5 = *(long *)&pvVar4[uVar17].super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data;
        pvVar6 = (Matrix->
                 super__Vector_base<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>,_std::allocator<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        uVar16 = 0;
        do {
          uVar15 = 1L << ((byte)uVar16 & 0x3f);
          uVar18 = uVar16 >> 6;
          if ((*(ulong *)(lVar5 + uVar18 * 8) >> (uVar16 & 0x3f) & 1) != 0) {
            if (uVar17 != 0) {
              piVar3 = (int *)(*(long *)&(pvVar6->
                                         super__Vector_base<s_DancingNode,_std::allocator<s_DancingNode>_>
                                         )._M_impl.super__Vector_impl_data + 0x30 + uVar16 * 0x38);
              *piVar3 = *piVar3 + 1;
            }
            lVar13 = uVar16 * 0x38;
            lVar7 = *(long *)&pvVar6[uVar17].
                              super__Vector_base<s_DancingNode,_std::allocator<s_DancingNode>_>.
                              _M_impl;
            plVar2 = (long *)(lVar7 + lVar13);
            *(long *)(lVar7 + 0x20 + lVar13) =
                 *(long *)&(pvVar6->
                           super__Vector_base<s_DancingNode,_std::allocator<s_DancingNode>_>).
                           _M_impl.super__Vector_impl_data + lVar13;
            *(int *)(lVar7 + 0x28 + lVar13) = (int)uVar17;
            *(int *)(lVar7 + 0x2c + lVar13) = (int)uVar16;
            uVar11 = uVar16 & 0xffffffff;
            do {
              iVar12 = (int)uVar11;
              if ((int)uVar11 < 1) {
                iVar12 = nCol;
              }
              uVar11 = (ulong)(iVar12 - 1U);
              uVar1 = (long)iVar12 - 1;
              uVar14 = (long)iVar12 + 0x3e;
              if (-1 < (long)uVar1) {
                uVar14 = uVar1;
              }
            } while ((uVar16 != uVar11) &&
                    ((1L << ((byte)(iVar12 - 1U) & 0x3f) &
                     *(ulong *)(((long)uVar14 >> 6) * 8 + lVar5 + -8 +
                               (ulong)((uVar1 & 0x800000000000003f) < 0x8000000000000001) * 8)) == 0
                    ));
            *plVar2 = uVar1 * 0x38 + lVar7;
            uVar11 = uVar16 & 0xffffffff;
            do {
              uVar1 = (long)((int)uVar11 + 1) % (long)nCol;
              uVar11 = uVar1 & 0xffffffff;
              uVar10 = (ulong)(int)uVar1;
              uVar14 = uVar10 + 0x3f;
              if (-1 < (long)uVar10) {
                uVar14 = uVar10;
              }
            } while ((uVar16 != uVar11) &&
                    ((1L << ((byte)uVar1 & 0x3f) &
                     *(ulong *)(((long)uVar14 >> 6) * 8 + lVar5 + -8 +
                               (ulong)((uVar10 & 0x800000000000003f) < 0x8000000000000001) * 8)) ==
                     0));
            plVar2[1] = lVar7 + uVar10 * 0x38;
            uVar11 = uVar17 & 0xffffffff;
            do {
              iVar12 = (int)uVar11;
              if ((int)uVar11 < 1) {
                iVar12 = nRow;
              }
              uVar9 = iVar12 - 1;
              uVar11 = (ulong)uVar9;
            } while ((uVar17 != uVar11) &&
                    ((*(ulong *)(*(long *)&pvVar4[(int)uVar9].
                                           super__Bvector_base<std::allocator<bool>_>._M_impl.
                                           super__Bvector_impl_data + uVar18 * 8) & uVar15) == 0));
            plVar2[2] = *(long *)&pvVar6[(int)uVar9].
                                  super__Vector_base<s_DancingNode,_std::allocator<s_DancingNode>_>.
                                  _M_impl + lVar13;
            uVar11 = uVar17 & 0xffffffff;
            do {
              uVar1 = (long)((int)uVar11 + 1) % (long)nRow;
              uVar11 = (ulong)(int)uVar1;
              if (uVar17 == (uVar1 & 0xffffffff)) break;
            } while ((*(ulong *)(*(long *)&pvVar4[uVar11].super__Bvector_base<std::allocator<bool>_>
                                           ._M_impl.super__Bvector_impl_data + uVar18 * 8) & uVar15)
                     == 0);
            plVar2[3] = lVar13 + *(long *)&pvVar6[uVar11].
                                           super__Vector_base<s_DancingNode,_std::allocator<s_DancingNode>_>
                                           ._M_impl;
          }
          uVar16 = uVar16 + 1;
        } while (uVar16 != (uint)nCol);
      }
      uVar17 = uVar17 + 1;
    } while (uVar17 != nRow + 1);
  }
  psVar8 = (((Matrix->
             super__Vector_base<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>,_std::allocator<std::vector<s_DancingNode,_std::allocator<s_DancingNode>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start)->
           super__Vector_base<s_DancingNode,_std::allocator<s_DancingNode>_>)._M_impl.
           super__Vector_impl_data._M_start;
  header->right = psVar8;
  header->left = psVar8 + (long)nCol + -1;
  psVar8->left = header;
  psVar8[(long)nCol + -1].right = header;
  return header;
}

Assistant:

DancingNode *createToridolMatrix(vector<vector<DancingNode>> &Matrix, int nRow, int nCol, vector<vector<bool>> &ProbMat, DancingNode *header) 
{ 
    // One extra row for list header nodes 
    // for each column 
    for(int i = 0; i <= nRow; i++) 
    { 
        for(int j = 0; j < nCol; j++) 
        { 
            // If it's 1 in the problem matrix then  
            // only create a node  
            if(ProbMat[i][j]) 
            {   
                int a, b; 
                //Matrix[i].push_back(DancingNode()); 
                // If it's 1, other than 1 in 0th row 
                // then count it as node of column  
                // and increment node count in column header 
                if(i) Matrix[0][j].nodeCount += 1; 
  
                // Add pointer to column header for this  
                // column node 
                Matrix[i][j].column = &Matrix[0][j]; 
  
                // set row and column id of this node 
                Matrix[i][j].row = i; 
                Matrix[i][j].col = j; 
  
                // Link the node with neighbors 
                // Left pointer 
                a = i; b = j; 
                do{ b = getLeft(b, nCol); } while(!ProbMat[a][b] && b != j); 
                Matrix[i][j].left = &Matrix[i][b]; 
                
                // Right pointer 
                a = i; b = j; 
                do { b = getRight(b, nCol); } while(!ProbMat[a][b] && b != j); 
                Matrix[i][j].right = &Matrix[i][b]; 
                
                // Up pointer 
                a = i; b = j; 
                do { a = getUp(a, nRow); } while(!ProbMat[a][b] && a != i); 
                Matrix[i][j].up = &Matrix[a][j]; 
  
                // Down pointer 
                a = i; b = j; 
                do { a = getDown(a, nRow); } while(!ProbMat[a][b] && a != i); 
                Matrix[i][j].down = &Matrix[a][j]; 
                
            } 
        } 
    } 
  
    // link header right pointer to column  
    // header of first column  
    header->right = &Matrix[0][0]; 
  
    // link header left pointer to column  
    // header of last column  
    header->left = &Matrix[0][nCol-1]; 
  
    Matrix[0][0].left = header; 
    Matrix[0][nCol-1].right = header; 
    return header; 
}